

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertFromStruct
          (ElementsDecodeRawTransactionTxIn *this,ElementsDecodeRawTransactionTxInStruct *data)

{
  ElementsDecodeIssuance *in_RSI;
  ElementsDecodeIssuanceStruct *in_RDI;
  
  std::__cxx11::string::operator=
            ((string *)((in_RDI->asset_entropy).field_2._M_local_buf + 8),(string *)in_RSI);
  std::__cxx11::string::operator=
            ((string *)
             &(((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&in_RDI->contract_hash)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (string *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  *(int *)&(in_RDI->token).field_2 = (int)(in_RSI->asset_blinding_nonce_)._M_string_length;
  ElementsDecodeUnlockingScript::ConvertFromStruct
            ((ElementsDecodeUnlockingScript *)in_RSI,(ElementsDecodeUnlockingScriptStruct *)in_RDI);
  (in_RDI->asset_rangeproof)._M_dataplus =
       (_Alloc_hider)((in_RSI->token_).field_2._M_local_buf[8] & 1);
  (in_RDI->asset_rangeproof)._M_string_length = *(size_type *)&in_RSI->asset_;
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)data);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)data);
  ElementsDecodeIssuance::ConvertFromStruct(in_RSI,in_RDI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
  return;
}

Assistant:

void ElementsDecodeRawTransactionTxIn::ConvertFromStruct(
    const ElementsDecodeRawTransactionTxInStruct& data) {
  coinbase_ = data.coinbase;
  txid_ = data.txid;
  vout_ = data.vout;
  script_sig_.ConvertFromStruct(data.script_sig);
  is_pegin_ = data.is_pegin;
  sequence_ = data.sequence;
  txinwitness_.ConvertFromStruct(data.txinwitness);
  pegin_witness_.ConvertFromStruct(data.pegin_witness);
  issuance_.ConvertFromStruct(data.issuance);
  ignore_items = data.ignore_items;
}